

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O2

string * __thiscall
cornelich::cycle_formatter::date_from_cycle_abi_cxx11_
          (string *__return_storage_ptr__,cycle_formatter *this,int64_t cycle)

{
  shared_ptr<cornelich::cycle_formatter::node_t> node;
  int64_t cycle_local;
  __shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2> local_68;
  shared_ptr<cornelich::cycle_formatter::node_t> cached;
  string local_48 [32];
  
  cycle_local = cycle;
  std::atomic_load<cornelich::cycle_formatter::node_t>(&cached);
  if ((cached.super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr == (element_type *)0x0) ||
     ((cached.super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr)->m_cycle != cycle)) {
    (*this->_vptr_cycle_formatter[3])(local_48,this,cycle);
    std::make_shared<cornelich::cycle_formatter::node_t,long&,std::__cxx11::string>
              ((long *)&node,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&cycle_local);
    std::__cxx11::string::~string(local_48);
    std::__shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_68,
               &node.
                super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>);
    std::atomic_store<cornelich::cycle_formatter::node_t>
              ((shared_ptr<cornelich::cycle_formatter::node_t> *)
               ((long)&(this->m_cache)._M_elems[0].
                       super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr + (ulong)(uint)((int)((ulong)cycle % 0x1f) << 4)),
               (shared_ptr<cornelich::cycle_formatter::node_t> *)&local_68);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               &(node.
                 super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_data);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&node.
                super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               &(cached.
                 super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_data);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cached.
              super___shared_ptr<cornelich::cycle_formatter::node_t,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

std::string cycle_formatter::date_from_cycle(std::int64_t cycle) const
{
    // TODO: Is it worth it...?
    auto hash = std::hash<std::int64_t>()(cycle) % (CACHE_SIZE - 1);
    auto cached = std::atomic_load(&m_cache[hash]);
    if(cached && cached->m_cycle == cycle)
    {
        // Cache hit - return the string
        return cached->m_data;
    }
    // Cache miss -> evaluate and cache the string
    auto node = std::make_shared<node_t>(cycle, date_from_cycle_impl(cycle));
    std::atomic_store(&m_cache[hash], node);
    return node->m_data;
}